

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O3

void __thiscall
ConvexDecomposition::CTri::debug(CTri *this,uint color,ConvexDecompInterface *callback)

{
  Vector3d *pVVar1;
  
  pVVar1 = &this->mP2;
  (*callback->_vptr_ConvexDecompInterface[2])(callback,this,pVVar1,&this->mP3,(ulong)color);
  (*callback->_vptr_ConvexDecompInterface[2])(callback,this,this,&this->mNear1,0xff0000);
  (*callback->_vptr_ConvexDecompInterface[2])(callback,pVVar1,pVVar1,&this->mNear2,0xff0000);
  (*callback->_vptr_ConvexDecompInterface[2])(callback,pVVar1,&this->mP3,&this->mNear3,0xff0000);
  (*callback->_vptr_ConvexDecompInterface[3])
            (SUB648(ZEXT464(0x3c23d70a),0),callback,&this->mNear1,0xff0000);
  (*callback->_vptr_ConvexDecompInterface[3])
            (SUB648(ZEXT464(0x3c23d70a),0),callback,&this->mNear2,0xff0000);
  (*callback->_vptr_ConvexDecompInterface[3])
            (SUB648(ZEXT464(0x3c23d70a),0),callback,&this->mNear3,0xff0000);
  return;
}

Assistant:

void debug(unsigned int color,ConvexDecompInterface *callback)
  {
    callback->ConvexDebugTri( mP1.Ptr(), mP2.Ptr(), mP3.Ptr(), color );
    callback->ConvexDebugTri( mP1.Ptr(), mP1.Ptr(), mNear1.Ptr(), 0xFF0000 );
    callback->ConvexDebugTri( mP2.Ptr(), mP2.Ptr(), mNear2.Ptr(), 0xFF0000 );
    callback->ConvexDebugTri( mP2.Ptr(), mP3.Ptr(), mNear3.Ptr(), 0xFF0000 );
    callback->ConvexDebugPoint( mNear1.Ptr(), 0.01f, 0xFF0000 );
    callback->ConvexDebugPoint( mNear2.Ptr(), 0.01f, 0xFF0000 );
    callback->ConvexDebugPoint( mNear3.Ptr(), 0.01f, 0xFF0000 );
  }